

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O0

int __thiscall
glcts::ViewportArray::Utils::texture::bind(texture *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  deUint32 dVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  Functions *gl;
  texture *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  if ((this->m_is_array & 1U) == 0) {
    (**(code **)(lVar4 + 0xb8))(0xde1,this->m_id);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x2d5);
    iVar1 = extraout_EAX;
  }
  else {
    (**(code **)(lVar4 + 0xb8))(0x8c1a,this->m_id);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x2da);
    iVar1 = extraout_EAX_00;
  }
  return iVar1;
}

Assistant:

void Utils::texture::bind() const
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (false == m_is_array)
	{
		gl.bindTexture(GL_TEXTURE_2D, m_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");
	}
	else
	{
		gl.bindTexture(GL_TEXTURE_2D_ARRAY, m_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");
	}
}